

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPlumeRecord.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GaussianPlumeRecord::Decode(GaussianPlumeRecord *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x57 < KVar1) {
    KDataStream::Read<unsigned_int>(stream,&(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
    KDataStream::Read<unsigned_short>(stream,&(this->super_EnvironmentRecord).m_ui16Length);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Index);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Padding);
    (*(this->m_SrcLocation).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_SrcLocation,stream);
    (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
    (*(this->m_PlumeLWH).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_PlumeLWH,stream);
    (*(this->m_DDTLEH).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_DDTLEH,stream);
    KDataStream::Read<float>(stream,(float *)&this->m_f32LdEdgeCenHght);
    (*(this->m_LdEdgeVel).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_LdEdgeVel,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GaussianPlumeRecord::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GAUSSIAN_PLUME_RECORD_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_SrcLocation
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_PlumeLWH
           >> KDIS_STREAM m_DDTLEH
           >> m_f32LdEdgeCenHght
           >> KDIS_STREAM m_LdEdgeVel
           >> m_ui32Padding;
}